

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O0

ALLEGRO_FS_INTERFACE * al_get_fs_interface(void)

{
  thread_local_state *ptVar1;
  thread_local_state *tls;
  ALLEGRO_FS_INTERFACE *local_8;
  
  ptVar1 = tls_get();
  if (ptVar1 == (thread_local_state *)0x0) {
    local_8 = &_al_fs_interface_stdio;
  }
  else if (ptVar1->fs_interface == (ALLEGRO_FS_INTERFACE *)0x0) {
    local_8 = &_al_fs_interface_stdio;
  }
  else {
    local_8 = ptVar1->fs_interface;
  }
  return local_8;
}

Assistant:

const ALLEGRO_FS_INTERFACE *al_get_fs_interface(void)
{
   thread_local_state *tls;

   if ((tls = tls_get()) == NULL)
      return &_al_fs_interface_stdio;

   if (tls->fs_interface)
      return tls->fs_interface;
   else
      return &_al_fs_interface_stdio;
}